

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O1

void __thiscall
TEST_PlayerHandTest_Triplet_Test::~TEST_PlayerHandTest_Triplet_Test
          (TEST_PlayerHandTest_Triplet_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupPlayerHandTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupPlayerHandTest_001dbe90;
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector
            (&(this->super_TEST_GROUP_CppUTestGroupPlayerHandTest).h.melds);
  std::
  _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
  ::~_Rb_tree(&(this->super_TEST_GROUP_CppUTestGroupPlayerHandTest).h.tiles._M_t);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x60);
  return;
}

Assistant:

TEST(PlayerHandTest, Triplet)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);

	h.bindTriplet({
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles
	});

	CHECK(!h.isClosedHand());
}